

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O2

char * fruitname(boolean juice)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  
  nextobuf_bufidx = (nextobuf_bufidx + 1) % 0xc;
  lVar1 = (long)nextobuf_bufidx;
  pcVar2 = strstri(pl_fruit," of ");
  pcVar3 = pcVar2 + 4;
  if (pcVar2 == (char *)0x0) {
    pcVar3 = pl_fruit;
  }
  pcVar3 = makesingular(pcVar3);
  pcVar2 = " juice";
  if (juice == '\0') {
    pcVar2 = "";
  }
  sprintf(nextobuf_bufs + lVar1 * 0x100,"%s%s",pcVar3,pcVar2);
  return nextobuf_bufs + lVar1 * 0x100;
}

Assistant:

char *fruitname(boolean juice)
{
    char *buf = nextobuf();
    const char *fruit_nam = strstri(pl_fruit, " of ");

    if (fruit_nam)
	fruit_nam += 4;		/* skip past " of " */
    else
	fruit_nam = pl_fruit;	/* use it as is */

    sprintf(buf, "%s%s", makesingular(fruit_nam), juice ? " juice" : "");
    return buf;
}